

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::character<'f'>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator f;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  region local_a0;
  region local_58;
  
  f._M_current = (loc->iter_)._M_current;
  if ((f._M_current ==
       (((loc->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish) || (*f._M_current != 'f')) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    loc->line_number_ = loc->line_number_ + (ulong)(*f._M_current == '\n');
    (loc->iter_)._M_current = f._M_current + 1;
    region::region(&local_58,loc,f,(const_iterator)(f._M_current + 1));
    sVar6 = local_58.source_name_._M_string_length;
    _Var5._M_pi = local_58.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar4 = local_58.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    paVar2 = &local_a0.source_name_.field_2;
    local_a0.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001a7798;
    local_58.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_58.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    paVar3 = &local_58.source_name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.source_name_._M_dataplus._M_p == paVar3) {
      local_a0.source_name_.field_2._8_8_ = local_58.source_name_.field_2._8_8_;
      local_a0.source_name_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.source_name_._M_dataplus._M_p = local_58.source_name_._M_dataplus._M_p;
    }
    local_a0.source_name_.field_2._M_allocated_capacity._1_7_ =
         local_58.source_name_.field_2._M_allocated_capacity._1_7_;
    local_a0.source_name_.field_2._M_local_buf[0] = local_58.source_name_.field_2._M_local_buf[0];
    local_58.source_name_._M_string_length = 0;
    local_58.source_name_.field_2._M_local_buf[0] = '\0';
    local_a0.first_._M_current = local_58.first_._M_current;
    local_a0.last_._M_current = local_58.last_._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_001a7798;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar4;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    local_a0.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.source_name_._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity = local_a0.source_name_.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8)
           = local_a0.source_name_.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
           local_a0.source_name_._M_dataplus._M_p;
      (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
           local_a0.source_name_.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar6;
    local_a0.source_name_._M_string_length = 0;
    local_a0.source_name_.field_2._M_allocated_capacity =
         (ulong)(uint7)local_58.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.first_._M_current = local_58.first_._M_current;
    (__return_storage_ptr__->field_1).succ.value.last_._M_current = local_58.last_._M_current;
    local_a0.source_name_._M_dataplus._M_p = (pointer)paVar2;
    local_58.source_name_._M_dataplus._M_p = (pointer)paVar3;
    region::~region(&local_a0);
    region::~region(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        if(loc.iter() == loc.end()) {return none();}
        const auto first = loc.iter();

        const char c = *(loc.iter());
        if(c != target)
        {
            return none();
        }
        loc.advance(); // update location

        return ok(region(loc, first, loc.iter()));
    }